

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

pointer __thiscall
slang::SmallVectorBase<int>::emplaceRealloc<>(SmallVectorBase<int> *this,pointer pos)

{
  size_type sVar1;
  size_type sVar2;
  size_type sVar3;
  iterator piVar4;
  long lVar5;
  pointer piVar6;
  iterator piVar7;
  EVP_PKEY_CTX *ctx;
  iterator in_RSI;
  SmallVectorBase<int> *in_RDI;
  pointer newPos;
  pointer newData;
  size_type offset;
  size_type newCap;
  int *in_stack_ffffffffffffffa0;
  int *in_stack_ffffffffffffffa8;
  size_type in_stack_ffffffffffffffb0;
  iterator __first;
  SmallVectorBase<int> *in_stack_ffffffffffffffb8;
  
  sVar1 = in_RDI->len;
  sVar2 = max_size((SmallVectorBase<int> *)0x9289c6);
  if (sVar1 == sVar2) {
    detail::throwLengthError();
  }
  sVar3 = calculateGrowth(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  __first = in_RSI;
  piVar4 = begin(in_RDI);
  lVar5 = (long)__first - (long)piVar4;
  piVar6 = (pointer)operator_new(0x928a25);
  piVar6[lVar5 >> 2] = 0;
  piVar4 = in_RSI;
  piVar7 = end(in_RDI);
  if (piVar4 == piVar7) {
    piVar4 = begin(in_RDI);
    ctx = (EVP_PKEY_CTX *)end(in_RDI);
    std::uninitialized_move<int*,int*>(__first,piVar4,in_stack_ffffffffffffffa0);
  }
  else {
    begin(in_RDI);
    std::uninitialized_move<int*,int*>(__first,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    ctx = (EVP_PKEY_CTX *)end(in_RDI);
    std::uninitialized_move<int*,int*>(__first,in_stack_ffffffffffffffa8,in_RSI);
  }
  cleanup(in_RDI,ctx);
  in_RDI->len = in_RDI->len + 1;
  in_RDI->cap = sVar3;
  in_RDI->data_ = piVar6;
  return piVar6 + (lVar5 >> 2);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}